

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O2

void free_staticCache(staticCache *Cache)

{
  static_record_data *psVar1;
  static_record_data *__ptr;
  int i;
  long lVar2;
  
  if (Cache->is_init == true) {
    free_hashtable(&Cache->table);
    for (lVar2 = 0; lVar2 < Cache->top; lVar2 = lVar2 + 1) {
      free(Cache->data[lVar2].label);
      __ptr = Cache->data + lVar2;
      while (__ptr != (static_record_data *)0x0) {
        psVar1 = __ptr->next;
        free(__ptr);
        __ptr = psVar1;
      }
    }
    free(Cache->data);
    Cache->is_init = false;
  }
  return;
}

Assistant:

void free_staticCache(struct staticCache* Cache){
  if(Cache->is_init==true){
    struct static_record_data* data=NULL,*tmp=NULL;
    free_hashtable(&Cache->table);//释放哈希表
    for(int i=0;i<Cache->top;i++){//释放字符串
      free(Cache->data[i].label);
      tmp = data=&Cache->data[i];
      while(data){
        data = data->next;
        free(tmp);
        tmp = data;
      }
    }
    free(Cache->data);//释放数组
    Cache->is_init = false;
  }
}